

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

u16 __thiscall moira::Moira::getSR(Moira *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int flags;
  Moira *this_local;
  
  bVar1 = (this->reg).sr.t1;
  bVar2 = (this->reg).sr.t0;
  bVar3 = (this->reg).sr.s;
  bVar4 = (this->reg).sr.m;
  bVar5 = (this->reg).sr.ipl;
  bVar6 = getCCR(this);
  return (ushort)(bVar1 & 1) << 0xf | (ushort)(bVar2 & 1) << 0xe | (ushort)(bVar3 & 1) << 0xd |
         (ushort)(bVar4 & 1) << 0xc | (ushort)bVar5 << 8 | (ushort)bVar6;
}

Assistant:

u16
Moira::getSR() const
{
    auto flags =
    reg.sr.t1  << 15 |
    reg.sr.t0  << 14 |
    reg.sr.s   << 13 |
    reg.sr.m   << 12 |
    reg.sr.ipl <<  8 ;

    return u16(flags | getCCR());
}